

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmcursor.cpp
# Opt level: O1

void __thiscall QEglFSKmsGbmCursor::initCursorAtlas(QEglFSKmsGbmCursor *this)

{
  QPlatformScreen *pQVar1;
  double dVar2;
  double dVar3;
  int *piVar4;
  QDebug this_00;
  char cVar5;
  int iVar6;
  long lVar7;
  QList<QPoint> *this_01;
  long lVar8;
  iterator iVar9;
  iterator iVar10;
  char *pcVar11;
  int iVar12;
  QEglFSKmsScreen *kmsScreen;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  undefined1 auVar18 [16];
  QJsonArray hotSpots;
  QJsonObject object;
  QJsonDocument doc;
  QJsonArray local_d8 [8];
  QJsonArray local_d0 [8];
  QPoint local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  char *local_a8;
  qsizetype qStack_a0;
  QList<QPlatformScreen_*> local_98;
  undefined8 local_80;
  QDebug local_70 [3];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (initCursorAtlas()::json == '\0') {
    initCursorAtlas();
  }
  if (initCursorAtlas::json.d.size == 0) {
    QByteArray::operator=(&initCursorAtlas::json,":/cursor.json");
  }
  lVar7 = QtPrivateLogging::qLcEglfsKmsDebug();
  if ((*(byte *)(lVar7 + 0x10) & 1) != 0) {
    local_80 = *(undefined8 *)(lVar7 + 8);
    local_98.d.d._0_4_ = 2;
    local_98.d.d._4_4_ = 0;
    local_98.d.ptr._0_4_ = 0;
    local_98.d.ptr._4_4_ = 0;
    local_98.d.size._0_4_ = 0;
    local_98.d.size._4_4_ = 0;
    QMessageLogger::debug();
    this_00.stream = local_70[0].stream;
    QVar13.m_data = (storage_type *)0x1e;
    QVar13.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)this_00.stream,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)(local_70[0].stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70[0].stream,' ');
    }
    pcVar11 = initCursorAtlas::json.d.ptr;
    if (initCursorAtlas::json.d.ptr == (char *)0x0) {
      pcVar11 = (char *)&QByteArray::_empty;
    }
    QDebug::putByteArray
              ((char *)local_70,(ulong)pcVar11,(Latin1Content)initCursorAtlas::json.d.size);
    if (*(QTextStream *)(local_70[0].stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70[0].stream,' ');
    }
    QDebug::~QDebug(local_70);
  }
  local_a8 = (char *)0xaaaaaaaaaaaaaaaa;
  qStack_a0 = -0x5555555555555556;
  QVar14.m_data = (storage_type *)initCursorAtlas::json.d.size;
  QVar14.m_size = (qsizetype)&local_98;
  QString::fromUtf8(QVar14);
  QFile::QFile((QFile *)&local_a8,(QString *)&local_98);
  piVar4 = (int *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_),2,0x10);
    }
  }
  cVar5 = QFile::open(&local_a8,1);
  if (cVar5 == '\0') {
    (**(code **)(*(long *)this->m_screen + 0x88))(&local_98);
    iVar9 = QList<QPlatformScreen_*>::begin(&local_98);
    iVar10 = QList<QPlatformScreen_*>::end(&local_98);
    for (; iVar9.i != iVar10.i; iVar9.i = iVar9.i + 1) {
      pQVar1 = *iVar9.i;
      iVar12 = QKmsDevice::fd(*(QKmsDevice **)(pQVar1 + 0x28));
      drmModeSetCursor(iVar12,*(undefined4 *)(pQVar1 + 0x50),0,0,0);
      iVar12 = QKmsDevice::fd(*(QKmsDevice **)(pQVar1 + 0x28));
      drmModeMoveCursor(iVar12,*(undefined4 *)(pQVar1 + 0x50),0);
    }
    piVar4 = (int *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_),8,0x10)
        ;
      }
    }
    this->m_state = CursorDisabled;
  }
  else {
    local_b0 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QJsonDocument::fromJson((QByteArray *)local_b0,(QJsonParseError *)&local_98);
    piVar4 = (int *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_),1,0x10)
        ;
      }
    }
    local_b8 = 0xaaaaaaaaaaaaaaaa;
    QJsonDocument::object();
    local_98.d.size._0_4_ = 0xaaaaaaaa;
    local_98.d.size._4_4_ = 0xaaaaaaaa;
    local_98.d.d._0_4_ = 0xaaaaaaaa;
    local_98.d.d._4_4_ = 0xaaaaaaaa;
    local_98.d.ptr._0_4_ = 0xaaaaaaaa;
    local_98.d.ptr._4_4_ = 0xaaaaaaaa;
    QVar15.m_data = (char *)&local_b8;
    QVar15.m_size = (qsizetype)&local_58;
    QJsonObject::value(QVar15);
    QJsonValue::toString();
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
    QVar16.m_data = (char *)&local_b8;
    QVar16.m_size = (qsizetype)&local_58;
    QJsonObject::value(QVar16);
    dVar2 = (double)QJsonValue::toDouble(0.0);
    iVar12 = (int)dVar2;
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
    (this->m_cursorAtlas).cursorsPerRow = iVar12;
    local_c0 = 0xaaaaaaaaaaaaaaaa;
    QVar17.m_data = (char *)&local_b8;
    QVar17.m_size = (qsizetype)&local_58;
    QJsonObject::value(QVar17);
    QJsonValue::toArray();
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
    lVar7 = QJsonArray::size();
    if (0 < lVar7) {
      this_01 = &(this->m_cursorAtlas).hotSpots;
      lVar7 = 0;
      do {
        local_c8.xp.m_i = -0x55555556;
        local_c8.yp.m_i = -0x55555556;
        QJsonArray::operator[]((longlong)&local_58);
        QJsonValue::toArray();
        auVar18 = QJsonArray::operator[]((longlong)local_d0);
        dVar3 = (double)QJsonValueConstRef::concreteDouble(0,auVar18._0_8_,auVar18._8_8_);
        QJsonArray::operator[]((longlong)local_70);
        QJsonValue::toArray();
        auVar18 = QJsonArray::operator[]((longlong)local_d8);
        dVar2 = (double)QJsonValueConstRef::concreteDouble(0,auVar18._0_8_,auVar18._8_8_);
        local_c8.yp.m_i = (int)dVar2;
        local_c8.xp.m_i = (int)dVar3;
        QJsonArray::~QJsonArray(local_d8);
        QJsonValue::~QJsonValue((QJsonValue *)local_70);
        QJsonArray::~QJsonArray(local_d0);
        QJsonValue::~QJsonValue((QJsonValue *)&local_58);
        QtPrivate::QPodArrayOps<QPoint>::emplace<QPoint_const&>
                  ((QPodArrayOps<QPoint> *)this_01,(this->m_cursorAtlas).hotSpots.d.size,&local_c8);
        QList<QPoint>::end(this_01);
        lVar7 = lVar7 + 1;
        lVar8 = QJsonArray::size();
      } while (lVar7 < lVar8);
    }
    local_58.d.size = -0x5555555555555556;
    local_58.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)local_70,(QString *)&local_98,(char *)0x0);
    QImage::convertToFormat
              ((QImage *)&local_58,(Format)(QImage *)local_70,(ImageConversionFlags)0x5);
    QImage::~QImage((QImage *)local_70);
    iVar6 = QImage::width();
    (this->m_cursorAtlas).cursorWidth = iVar6 / (this->m_cursorAtlas).cursorsPerRow;
    iVar6 = QImage::height();
    (this->m_cursorAtlas).cursorHeight = iVar6 / ((iVar12 + 0x15) / iVar12);
    iVar12 = QImage::width();
    (this->m_cursorAtlas).width = iVar12;
    iVar12 = QImage::height();
    (this->m_cursorAtlas).height = iVar12;
    QImage::operator=(&(this->m_cursorAtlas).image,(QImage *)&local_58);
    QImage::~QImage((QImage *)&local_58);
    QJsonArray::~QJsonArray((QJsonArray *)&local_c0);
    piVar4 = (int *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_98.d.d._4_4_,local_98.d.d._0_4_),2,0x10)
        ;
      }
    }
    QJsonObject::~QJsonObject((QJsonObject *)&local_b8);
    QJsonDocument::~QJsonDocument((QJsonDocument *)local_b0);
  }
  QFile::~QFile((QFile *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsGbmCursor::initCursorAtlas()
{
    static QByteArray json = qgetenv("QT_QPA_EGLFS_CURSOR");
    if (json.isEmpty())
        json = ":/cursor.json";

    qCDebug(qLcEglfsKmsDebug) << "Initializing cursor atlas from" << json;

    QFile file(QString::fromUtf8(json));
    if (!file.open(QFile::ReadOnly)) {
        for (QPlatformScreen *screen : m_screen->virtualSiblings()) {
            QEglFSKmsScreen *kmsScreen = static_cast<QEglFSKmsScreen *>(screen);
            drmModeSetCursor(kmsScreen->device()->fd(), kmsScreen->output().crtc_id, 0, 0, 0);
            drmModeMoveCursor(kmsScreen->device()->fd(), kmsScreen->output().crtc_id, 0, 0);
        }
        m_state = CursorDisabled;
        return;
    }

    QJsonDocument doc = QJsonDocument::fromJson(file.readAll());
    QJsonObject object = doc.object();

    QString atlas = object.value("image"_L1).toString();
    Q_ASSERT(!atlas.isEmpty());

    const int cursorsPerRow = object.value("cursorsPerRow"_L1).toDouble();
    Q_ASSERT(cursorsPerRow);
    m_cursorAtlas.cursorsPerRow = cursorsPerRow;

    const QJsonArray hotSpots = object.value("hotSpots"_L1).toArray();
    Q_ASSERT(hotSpots.count() == Qt::LastCursor + 1);
    for (int i = 0; i < hotSpots.count(); i++) {
        QPoint hotSpot(hotSpots[i].toArray()[0].toDouble(), hotSpots[i].toArray()[1].toDouble());
        m_cursorAtlas.hotSpots << hotSpot;
    }

    QImage image = QImage(atlas).convertToFormat(QImage::Format_ARGB32);
    m_cursorAtlas.cursorWidth = image.width() / m_cursorAtlas.cursorsPerRow;
    m_cursorAtlas.cursorHeight = image.height() / ((Qt::LastCursor + cursorsPerRow) / cursorsPerRow);
    m_cursorAtlas.width = image.width();
    m_cursorAtlas.height = image.height();
    m_cursorAtlas.image = image;
}